

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O1

MacroFormalArgumentListSyntax * __thiscall
slang::parsing::Preprocessor::MacroParser::parseFormalArgumentList(MacroParser *this)

{
  BumpAllocator *this_00;
  MacroFormalArgumentSyntax *pMVar1;
  undefined4 extraout_var;
  MacroFormalArgumentListSyntax *pMVar2;
  undefined8 extraout_RDX;
  Token TVar3;
  Token closeParen;
  Token openParen;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> arguments;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_130;
  undefined1 local_120;
  Token local_118;
  Token local_108;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_f8 [4];
  
  local_130._M_first._M_storage.info = (Info *)local_130._M_rest;
  local_108 = consume(this);
  Token::Token(&local_118);
  local_f8[0].len = 0;
  local_f8[0].cap = 8;
  local_f8[0].data_ = (pointer)local_f8[0].firstElement;
  local_130._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseFormalArgument(this);
  local_120 = 1;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
            (local_f8,(TokenOrSyntax *)&local_130._M_first);
  TVar3 = peek(this);
  if (TVar3.kind == Comma) {
    do {
      local_130._M_first._M_storage = (_Uninitialized<slang::parsing::Token,_true>)consume(this);
      local_120 = 0;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_f8,(TokenOrSyntax *)&local_130._M_first);
      pMVar1 = parseFormalArgument(this);
      local_130._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pMVar1;
      local_120 = 1;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_f8,(TokenOrSyntax *)&local_130._M_first);
      TVar3 = peek(this);
    } while (TVar3.kind == Comma);
  }
  local_118 = expect(this,CloseParenthesis);
  this_00 = this->pp->alloc;
  local_130._0_4_ =
       SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                 (local_f8,(EVP_PKEY_CTX *)this->pp->alloc,(EVP_PKEY_CTX *)local_118.info);
  local_130._M_first._M_storage.rawLen = extraout_var;
  local_130._M_first._M_storage.info = (Info *)extraout_RDX;
  pMVar2 = BumpAllocator::
           emplace<slang::syntax::MacroFormalArgumentListSyntax,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
                     (this_00,&local_108,
                      (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)
                      &local_130._M_first,&local_118);
  if (local_f8[0].data_ != (pointer)local_f8[0].firstElement) {
    operator_delete(local_f8[0].data_);
  }
  return pMVar2;
}

Assistant:

MacroFormalArgumentListSyntax* Preprocessor::MacroParser::parseFormalArgumentList() {
    auto openParen = consume();

    Token closeParen;
    SmallVector<TokenOrSyntax, 8> arguments;
    parseArgumentList(arguments, [this]() { return parseFormalArgument(); }, closeParen);

    return pp.alloc.emplace<MacroFormalArgumentListSyntax>(openParen, arguments.copy(pp.alloc),
                                                           closeParen);
}